

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAdaptiveRhoTolerance_Test::~OsqpTest_GetAdaptiveRhoTolerance_Test
          (OsqpTest_GetAdaptiveRhoTolerance_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAdaptiveRhoTolerance) {
  OsqpSettings settings;
  settings.adaptive_rho_tolerance = 17.0;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  const auto adaptive_rho_tolerance = solver.GetAdaptiveRhoTolerance();
  ASSERT_TRUE(adaptive_rho_tolerance.ok());
  EXPECT_EQ(*adaptive_rho_tolerance, 17);
}